

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adopt.c
# Opt level: O1

lws * lws_adopt_descriptor_vhost2(lws *new_wsi,lws_adoption_type type,lws_sock_file_fd_type fd)

{
  byte *pbVar1;
  uint16_t uVar2;
  _func_int_lws_ptr *p_Var3;
  int iVar4;
  char *format;
  uint16_t uVar5;
  
  iVar4 = lws_plat_set_nonblocking(fd.sockfd);
  if ((type & LWS_ADOPT_SOCKET) == LWS_ADOPT_RAW_FILE_DESC) {
    if (iVar4 == 0) goto LAB_00138485;
    format = "%s: unable to set filefd nonblocking\n";
LAB_00138447:
    iVar4 = 1;
LAB_00138453:
    _lws_log(iVar4,format,"lws_adopt_descriptor_vhost2");
  }
  else {
    if (iVar4 != 0) {
      _lws_log(1,"%s: unable to set sockfd %d nonblocking\n","lws_adopt_descriptor_vhost2",
               (ulong)(uint)fd.sockfd);
      goto LAB_00138568;
    }
LAB_00138485:
    new_wsi->desc = fd;
    if (((new_wsi->vhost == (lws_vhost *)0x0) ||
        ((type & LWS_ADOPT_SOCKET) == LWS_ADOPT_RAW_FILE_DESC)) ||
       ((new_wsi->vhost->tls).use_ssl == 0)) {
      type = type & ~LWS_ADOPT_ALLOW_SSL;
    }
    pbVar1 = (byte *)((long)&new_wsi->wsistate + 3);
    *pbVar1 = *pbVar1 | 0x20;
    uVar2 = new_wsi->role_ops->adoption_cb[1];
    uVar5 = 0x13;
    if (uVar2 != 0) {
      uVar5 = uVar2;
    }
    p_Var3 = new_wsi->context->event_loop_ops->sock_accept;
    if ((p_Var3 != (_func_int_lws_ptr *)0x0) && (iVar4 = (*p_Var3)(new_wsi), iVar4 != 0))
    goto LAB_00138568;
    if ((type & LWS_ADOPT_ALLOW_SSL) == LWS_ADOPT_RAW_FILE_DESC) {
      iVar4 = __insert_wsi_socket_into_fds(new_wsi->context,new_wsi);
      if (iVar4 != 0) {
        format = "%s: fail inserting socket\n";
        goto LAB_00138447;
      }
    }
    else {
      iVar4 = lws_server_socket_service_ssl(new_wsi,fd.sockfd);
      if (iVar4 != 0) {
        format = "%s: fail ssl negotiation\n";
        iVar4 = 8;
        goto LAB_00138453;
      }
    }
    lws_dll2_remove(&new_wsi->vh_awaiting_socket);
    iVar4 = (*new_wsi->protocol->callback)
                      (new_wsi,(lws_callback_reasons)uVar5,new_wsi->user_space,(void *)0x0,0);
    if (iVar4 == 0) {
      lws_role_call_adoption_bind(new_wsi,type | 0x1000000,new_wsi->protocol->name);
      lws_cancel_service_pt(new_wsi);
      return new_wsi;
    }
  }
LAB_00138568:
  if ((type & LWS_ADOPT_SOCKET) != LWS_ADOPT_RAW_FILE_DESC) {
    lws_close_free_wsi(new_wsi,LWS_CLOSE_STATUS_NOSTATUS,"adopt skt fail");
  }
  return (lws *)0x0;
}

Assistant:

static struct lws *
lws_adopt_descriptor_vhost2(struct lws *new_wsi, lws_adoption_type type,
			    lws_sock_file_fd_type fd)
{
	struct lws_context_per_thread *pt =
			&new_wsi->context->pt[(int)new_wsi->tsi];
	int n;

	/* enforce that every fd is nonblocking */

	if (type & LWS_ADOPT_SOCKET) {
		if (lws_plat_set_nonblocking(fd.sockfd)) {
			lwsl_err("%s: unable to set sockfd %d nonblocking\n",
				 __func__, fd.sockfd);
			goto fail;
		}
	}
#if !defined(WIN32)
	else
		if (lws_plat_set_nonblocking(fd.filefd)) {
			lwsl_err("%s: unable to set filefd nonblocking\n",
				 __func__);
			goto fail;
		}
#endif

	new_wsi->desc = fd;

	if (!LWS_SSL_ENABLED(new_wsi->vhost) ||
	    !(type & LWS_ADOPT_SOCKET))
		type &= ~LWS_ADOPT_ALLOW_SSL;

	/*
	 * A new connection was accepted. Give the user a chance to
	 * set properties of the newly created wsi. There's no protocol
	 * selected yet so we issue this to the vhosts's default protocol,
	 * itself by default protocols[0]
	 */
	new_wsi->wsistate |= LWSIFR_SERVER;
	n = LWS_CALLBACK_SERVER_NEW_CLIENT_INSTANTIATED;
	if (new_wsi->role_ops->adoption_cb[lwsi_role_server(new_wsi)])
		n = new_wsi->role_ops->adoption_cb[lwsi_role_server(new_wsi)];

	if (new_wsi->context->event_loop_ops->sock_accept)
		if (new_wsi->context->event_loop_ops->sock_accept(new_wsi))
			goto fail;

#if LWS_MAX_SMP > 1
	/*
	 * Caution: after this point the wsi is live on its service thread
	 * which may be concurrent to this.  We mark the wsi as still undergoing
	 * init in another pt so the assigned pt leaves it alone.
	 */
	new_wsi->undergoing_init_from_other_pt = 1;
#endif

	if (!(type & LWS_ADOPT_ALLOW_SSL)) {
		lws_pt_lock(pt, __func__);
		if (__insert_wsi_socket_into_fds(new_wsi->context, new_wsi)) {
			lws_pt_unlock(pt);
			lwsl_err("%s: fail inserting socket\n", __func__);
			goto fail;
		}
		lws_pt_unlock(pt);
	}
#if defined(LWS_WITH_SERVER)
	 else
		if (lws_server_socket_service_ssl(new_wsi, fd.sockfd)) {
#if defined(LWS_WITH_ACCESS_LOG)
			lwsl_notice("%s: fail ssl negotiation: %s\n", __func__,
					new_wsi->simple_ip);
#else
			lwsl_info("%s: fail ssl negotiation\n", __func__);
#endif
			goto fail;
		}
#endif

	/* he has fds visibility now, remove from vhost orphan list */
	lws_dll2_remove(&new_wsi->vh_awaiting_socket);

	/*
	 *  by deferring callback to this point, after insertion to fds,
	 * lws_callback_on_writable() can work from the callback
	 */
	if ((new_wsi->protocol->callback)(new_wsi, n, new_wsi->user_space,
					  NULL, 0))
		goto fail;

	/* role may need to do something after all adoption completed */

	lws_role_call_adoption_bind(new_wsi, type | _LWS_ADOPT_FINISH,
				    new_wsi->protocol->name);

#if LWS_MAX_SMP > 1
	/* its actual pt can service it now */

	new_wsi->undergoing_init_from_other_pt = 0;
#endif

	lws_cancel_service_pt(new_wsi);

	return new_wsi;

fail:
	if (type & LWS_ADOPT_SOCKET)
		lws_close_free_wsi(new_wsi, LWS_CLOSE_STATUS_NOSTATUS,
				   "adopt skt fail");

	return NULL;
}